

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

int ON_SolveCubicEquation(double a,double b,double c,double d,double *r1,double *r2,double *r3)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_a0;
  double B;
  double A;
  double temp_2;
  double temp_1;
  double temp;
  double Theta;
  double R;
  double Q;
  double dStack_58;
  int qrc;
  double rr1;
  double rr0;
  double *pdStack_40;
  int rc;
  double *r3_local;
  double *r2_local;
  double *r1_local;
  double d_local;
  double c_local;
  double b_local;
  double a_local;
  
  rr0._4_4_ = 0;
  pdStack_40 = r3;
  r3_local = r2;
  r2_local = r1;
  r1_local = (double *)d;
  d_local = c;
  c_local = b;
  b_local = a;
  if ((a != 0.0) || (NAN(a))) {
    if ((a != 1.0) || (NAN(a))) {
      c_local = b / a;
      d_local = c / a;
      r1_local = (double *)(d / a);
      b_local = 1.0;
    }
    dVar2 = (c_local * c_local + -(d_local * 3.0)) / 9.0;
    dVar3 = ((double)r1_local * 27.0 +
            c_local * 2.0 * c_local * c_local + -(c_local * 9.0 * d_local)) / 54.0;
    if (dVar2 * dVar2 * dVar2 <= dVar3 * dVar3) {
      dVar4 = sqrt(dVar3 * dVar3 + -(dVar2 * dVar2 * dVar2));
      B = pow(ABS(dVar3) + dVar4,0.3333333333333333);
      if (0.0 < dVar3) {
        B = -B;
      }
      local_a0 = 0.0;
      if ((B != 0.0) || (NAN(B))) {
        local_a0 = dVar2 / B;
      }
      *r2_local = (B + local_a0) - c_local / 3.0;
      *r3_local = -(B + local_a0) / 2.0 - c_local / 3.0;
      dVar2 = sqrt(1.5);
      *pdStack_40 = dVar2 * (B - local_a0);
      rr0._4_4_ = 1;
    }
    else {
      dVar4 = sqrt(dVar2 * dVar2 * dVar2);
      dVar3 = acos(dVar3 / dVar4);
      dVar4 = sqrt(dVar2);
      dVar5 = cos(dVar3 / 3.0);
      *r2_local = dVar4 * -2.0 * dVar5 + -(c_local / 3.0);
      dVar4 = sqrt(dVar2);
      dVar5 = cos((dVar3 + 6.283185307179586) / 3.0);
      *r3_local = dVar4 * -2.0 * dVar5 + -(c_local / 3.0);
      dVar2 = sqrt(dVar2);
      dVar3 = cos((dVar3 - 6.283185307179586) / 3.0);
      *pdStack_40 = dVar2 * -2.0 * dVar3 + -(c_local / 3.0);
      if (*r3_local <= *r2_local && *r2_local != *r3_local) {
        dVar2 = *r2_local;
        *r2_local = *r3_local;
        *r3_local = dVar2;
      }
      if (*pdStack_40 <= *r3_local && *r3_local != *pdStack_40) {
        dVar2 = *r3_local;
        *r3_local = *pdStack_40;
        *pdStack_40 = dVar2;
      }
      if (*r3_local <= *r2_local && *r2_local != *r3_local) {
        dVar2 = *r2_local;
        *r2_local = *r3_local;
        *r3_local = dVar2;
      }
      rr0._4_4_ = 3;
    }
  }
  else if ((b != 0.0) || (NAN(b))) {
    iVar1 = ON_SolveQuadraticEquation(b,c,d,&rr1,&stack0xffffffffffffffa8);
    if (iVar1 == 0) {
      *r2_local = rr1;
      *r3_local = dStack_58;
      rr0._4_4_ = 2;
    }
    else if (iVar1 == 1) {
      *r2_local = rr1;
      *r3_local = dStack_58;
      rr0._4_4_ = 2;
    }
    else if (iVar1 == 2) {
      *r2_local = rr1;
      *r3_local = dStack_58;
      rr0._4_4_ = 0;
    }
  }
  else if ((c != 0.0) || (NAN(c))) {
    *r1 = -d / c;
    rr0._4_4_ = 1;
  }
  else {
    rr0._4_4_ = -1;
  }
  return rr0._4_4_;
}

Assistant:

int ON_SolveCubicEquation(
  double a, double b, double c, double d,
  double* r1, double* r2, double* r3
)
{
  int rc = 0;
  if (a == 0.0)
  {
    if (b == 0.0)
    {
      if (c == 0.0)
      {
        // no roots
        rc = -1;
      }
      else
      {
        // linear equation
        *r1 = -d / c;
        rc = 1;
      }
    }
    else
    {
      // quadratic equation
      double rr0, rr1;
      int qrc = ON_SolveQuadraticEquation(b, c, d, &rr0, &rr1);
      switch (qrc)
      {
      case 0:
        // two distinct real roots (rr0 < rr1)
        *r1 = rr0;
        *r2 = rr1;
        rc = 2;
        break;
      case 1:
        // one real root (rr0 = rr1)
        *r1 = rr0;
        *r2 = rr1;
        rc = 2;
        break;
      case 2:
        // 2: two complex conjugate roots (rr0 +/- (rr1)*sqrt(-1))
        *r1 = rr0;
        *r2 = rr1;
        rc = 0;
        break;
      }
    }
  }
  else
  {
    if (a != 1.0)
    {
      // convert to normal form equation
      b = b / a;
      c = c / a;
      d = d / a;
      a = 1.0;
    }

    double Q = (b*b - 3.0 * c) / 9.0;
    double R = (2.0 * b*b*b - 9.0* b* c + 27.0 * d) / 54.0;

    if (R*R < Q*Q*Q)
    {
      // three real roots
      double Theta = acos(R / sqrt(Q*Q*Q));
      *r1 = -2.0 * sqrt(Q) * cos(Theta / 3.0) - b / 3.0;
      *r2 = -2.0 * sqrt(Q) * cos((Theta + 2.0*ON_PI) / 3.0) - b / 3.0;
      *r3 = -2.0 * sqrt(Q) * cos((Theta - 2.0*ON_PI) / 3.0) - b / 3.0;
      // inline bubble sort 
      if (*r1 > *r2) { double temp = *r1; *r1 = *r2; *r2 = temp; }
      if (*r2 > *r3) { double temp = *r2; *r2 = *r3; *r3 = temp; }
      if (*r1 > *r2) { double temp = *r1; *r1 = *r2; *r2 = temp; }
      rc = 3;
    }
    else
    {
      double A = pow(fabs(R) + sqrt(R*R - Q * Q*Q), 1.0 / 3.0);
      if (R > 0)
        A = -A;
      double B = 0;
      if (A != 0.0)
        B = Q / A;
      *r1 = (A + B) - b / 3;
      // the complex congate pair of roots are r2 +/- r3 i
      *r2 = -(A + B) / 2.0 - b / 3;
      *r3 = sqrt(3.0 / 2.0)*(A - B);
      rc = 1;
    }
  }
  return rc;
}